

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_extension_install_info.cpp
# Opt level: O2

void __thiscall
duckdb::ExtensionInstallInfo::Serialize(ExtensionInstallInfo *this,Serializer *serializer)

{
  Serializer::WriteProperty<duckdb::ExtensionInstallMode>(serializer,100,"mode",&this->mode);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x65,"full_path",&this->full_path);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x66,"repository_url",&this->repository_url);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x67,"version",&this->version);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0x68,"etag",&this->etag);
  return;
}

Assistant:

void ExtensionInstallInfo::Serialize(Serializer &serializer) const {
	serializer.WriteProperty<ExtensionInstallMode>(100, "mode", mode);
	serializer.WritePropertyWithDefault<string>(101, "full_path", full_path);
	serializer.WritePropertyWithDefault<string>(102, "repository_url", repository_url);
	serializer.WritePropertyWithDefault<string>(103, "version", version);
	serializer.WritePropertyWithDefault<string>(104, "etag", etag);
}